

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::bson::
basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::visit_null(basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
             *this,semantic_tag tag,ser_context *param_2,error_code *ec)

{
  uint8_t code;
  
  if ((this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::error_code::operator=(ec,expected_bson_document);
  }
  else {
    if (tag == undefined) {
      code = '\x06';
    }
    else {
      code = '\n';
    }
    before_value(this,code);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_null(semantic_tag tag, const ser_context&, std::error_code& ec) override
    {
        if (stack_.empty())
        {
            ec = bson_errc::expected_bson_document;
            JSONCONS_VISITOR_RETURN;
        }
        switch (tag)
        {
            case semantic_tag::undefined:
                before_value(jsoncons::bson::bson_type::undefined_type);
                break;
            default:
                before_value(jsoncons::bson::bson_type::null_type);
                break;
        }
        JSONCONS_VISITOR_RETURN;
    }